

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

int __thiscall Process::kill(Process *this,__pid_t __pid,int __sig)

{
  uint32 uVar1;
  int *piVar2;
  int iVar3;
  undefined8 unaff_RBP;
  bool bVar4;
  int status;
  int local_14;
  
  if (this->pid == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar3 = 0;
  }
  else {
    ::kill(this->pid,9);
    uVar1 = waitpid(this->pid,&local_14,0);
    bVar4 = uVar1 == this->pid;
    iVar3 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar4);
    if (bVar4) {
      if (this->fdStdOutRead != 0) {
        ::close(this->fdStdOutRead);
        this->fdStdOutRead = 0;
      }
      if (this->fdStdErrRead != 0) {
        ::close(this->fdStdErrRead);
        this->fdStdErrRead = 0;
      }
      if (this->fdStdInWrite != 0) {
        ::close(this->fdStdInWrite);
        this->fdStdInWrite = 0;
      }
      this->pid = 0;
    }
  }
  return iVar3;
}

Assistant:

bool Process::kill()
{
#ifdef _WIN32
  if(hProcess == INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }
  TerminateProcess(hProcess, EXIT_FAILURE);
  if(WaitForSingleObject(hProcess, INFINITE) != WAIT_OBJECT_0)
    return false;
  CloseHandle((HANDLE)hProcess);
  hProcess = INVALID_HANDLE_VALUE;
  if(hStdOutRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdOutRead);
    hStdOutRead = INVALID_HANDLE_VALUE;
  }
  if(hStdErrRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdErrRead);
    hStdErrRead = INVALID_HANDLE_VALUE;
  }
  if(hStdInWrite != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdInWrite);
    hStdInWrite = INVALID_HANDLE_VALUE;
  }
  pid = 0;
  return true;
#else
  if(!pid)
  {
    errno = EINVAL;
    return false;
  }
  ::kill((pid_t)pid, SIGKILL);
  int status;
  if(waitpid(pid, &status, 0) != (pid_t)pid)
    return false;
  if(fdStdOutRead)
  {
    ::close(fdStdOutRead);
    fdStdOutRead = 0;
  }
  if(fdStdErrRead)
  {
    ::close(fdStdErrRead);
    fdStdErrRead = 0;
  }
  if(fdStdInWrite)
  {
    ::close(fdStdInWrite);
    fdStdInWrite = 0;
  }
  pid = 0;
  return true;
#endif
}